

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_read_finish_row(png_structrp png_ptr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = png_ptr->row_number + 1;
  png_ptr->row_number = uVar5;
  if (png_ptr->num_rows <= uVar5) {
    if (png_ptr->interlaced == '\0') {
LAB_002ccebc:
      png_read_finish_IDAT(png_ptr);
      return;
    }
    png_ptr->row_number = 0;
    memset(png_ptr->prev_row,0,png_ptr->rowbytes + 1);
    bVar3 = png_ptr->pass + 1;
    do {
      bVar4 = bVar3;
      if (6 < bVar4) {
        png_ptr->pass = bVar4;
        goto LAB_002ccebc;
      }
      bVar1 = "\b\b\x04\x04\x02\x02\x01"[bVar4];
      uVar5 = ~(uint)""[bVar4] + png_ptr->width + (uint)bVar1;
      png_ptr->iwidth = uVar5 / bVar1;
      if ((png_ptr->transformations & 2) != 0) break;
      bVar2 = "\b\b\b\x04\x04\x02\x02"[bVar4];
      uVar6 = ~(uint)""[bVar4] + png_ptr->height + (uint)bVar2;
      png_ptr->num_rows = uVar6 / bVar2;
      bVar3 = bVar4 + 1;
    } while ((uVar6 < bVar2) || (uVar5 < bVar1));
    png_ptr->pass = bVar4;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_read_finish_row(png_structrp png_ptr)
{
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */

   /* Start of interlace block */
   static PNG_CONST png_byte png_pass_start[7] = {0, 4, 0, 2, 0, 1, 0};

   /* Offset to next interlace block */
   static PNG_CONST png_byte png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   /* Start of interlace block in the y direction */
   static PNG_CONST png_byte png_pass_ystart[7] = {0, 0, 4, 0, 2, 0, 1};

   /* Offset to next interlace block in the y direction */
   static PNG_CONST png_byte png_pass_yinc[7] = {8, 8, 8, 4, 4, 2, 2};

   png_debug(1, "in png_read_finish_row");
   png_ptr->row_number++;
   if (png_ptr->row_number < png_ptr->num_rows)
      return;

   if (png_ptr->interlaced != 0)
   {
      png_ptr->row_number = 0;

      /* TO DO: don't do this if prev_row isn't needed (requires
       * read-ahead of the next row's filter byte.
       */
      memset(png_ptr->prev_row, 0, png_ptr->rowbytes + 1);

      do
      {
         png_ptr->pass++;

         if (png_ptr->pass >= 7)
            break;

         png_ptr->iwidth = (png_ptr->width +
            png_pass_inc[png_ptr->pass] - 1 -
            png_pass_start[png_ptr->pass]) /
            png_pass_inc[png_ptr->pass];

         if ((png_ptr->transformations & PNG_INTERLACE) == 0)
         {
            png_ptr->num_rows = (png_ptr->height +
                png_pass_yinc[png_ptr->pass] - 1 -
                png_pass_ystart[png_ptr->pass]) /
                png_pass_yinc[png_ptr->pass];
         }

         else  /* if (png_ptr->transformations & PNG_INTERLACE) */
            break; /* libpng deinterlacing sees every row */

      } while (png_ptr->num_rows == 0 || png_ptr->iwidth == 0);

      if (png_ptr->pass < 7)
         return;
   }

   /* Here after at the end of the last row of the last pass. */
   png_read_finish_IDAT(png_ptr);
}